

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_radio.c
# Opt level: O3

void dlep_base_proto_radio_init(void)

{
  dlep_extension *pdVar1;
  
  _base = dlep_base_proto_init();
  dlep_extension_add_processing(_base,true,_radio_signals,0xf);
  oonf_class_extension_add(&_layer2_net_listener);
  oonf_class_extension_add(&_layer2_neigh_listener);
  oonf_class_extension_add(&_layer2_dst_listener);
  pdVar1 = _base;
  _base->cb_session_init_radio = _cb_init_radio;
  pdVar1->cb_session_cleanup_radio = _cb_cleanup_radio;
  return;
}

Assistant:

void
dlep_base_proto_radio_init(void) {
  _base = dlep_base_proto_init();
  dlep_extension_add_processing(_base, true, _radio_signals, ARRAYSIZE(_radio_signals));

  oonf_class_extension_add(&_layer2_net_listener);
  oonf_class_extension_add(&_layer2_neigh_listener);
  oonf_class_extension_add(&_layer2_dst_listener);

  _base->cb_session_init_radio = _cb_init_radio;
  _base->cb_session_cleanup_radio = _cb_cleanup_radio;
}